

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O3

QNetworkReply * __thiscall
QNetworkAccessManager::put(QNetworkAccessManager *this,QNetworkRequest *request,QByteArray *data)

{
  QNetworkAccessManagerPrivate *this_00;
  QBuffer *this_01;
  QNetworkReply *reply;
  
  this_01 = (QBuffer *)operator_new(0x10);
  QBuffer::QBuffer(this_01,(QObject *)0x0);
  QBuffer::setData((QByteArray *)this_01);
  (**(code **)(*(long *)this_01 + 0x68))(this_01,1);
  this_00 = *(QNetworkAccessManagerPrivate **)(this + 8);
  reply = (QNetworkReply *)(**(code **)(*(long *)this + 0x68))(this,3,request,this_01);
  QNetworkAccessManagerPrivate::postProcess(this_00,reply);
  QObject::setParent((QObject *)this_01);
  return reply;
}

Assistant:

QNetworkReply *QNetworkAccessManager::put(const QNetworkRequest &request, const QByteArray &data)
{
    QBuffer *buffer = new QBuffer;
    buffer->setData(data);
    buffer->open(QIODevice::ReadOnly);

    QNetworkReply *reply = put(request, buffer);
    buffer->setParent(reply);
    return reply;
}